

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_fractional.c
# Opt level: O0

void WebRtcSpl_Resample44khzTo32khz(int32_t *In,int32_t *Out,size_t K)

{
  ulong local_30;
  size_t m;
  int32_t tmp;
  size_t K_local;
  int32_t *Out_local;
  int32_t *In_local;
  
  K_local = (size_t)Out;
  Out_local = In;
  for (local_30 = 0; local_30 < K; local_30 = local_30 + 1) {
    *(int32_t *)K_local = Out_local[3] * 0x8000 + 0x4000;
    *(int32_t *)(K_local + 0x10) =
         Out_local[0xd] * 0x7e +
         Out_local[0xc] * -0x2c8 +
         Out_local[0xb] * 0x931 +
         Out_local[10] * -0x1866 +
         Out_local[9] * 0x54bb +
         Out_local[8] * 0x48ab +
         Out_local[7] * -0xf17 + Out_local[6] * 0x3ce + Out_local[5] * -0x9c + 0x4000;
    WebRtcSpl_ResampDotProduct
              (Out_local,Out_local + 0x11,kCoefficients44To32[0],(int32_t *)(K_local + 4),
               (int32_t *)(K_local + 0x1c));
    WebRtcSpl_ResampDotProduct
              (Out_local + 2,Out_local + 0xf,kCoefficients44To32[1],(int32_t *)(K_local + 8),
               (int32_t *)(K_local + 0x18));
    WebRtcSpl_ResampDotProduct
              (Out_local + 3,Out_local + 0xe,kCoefficients44To32[2],(int32_t *)(K_local + 0xc),
               (int32_t *)(K_local + 0x14));
    Out_local = Out_local + 0xb;
    K_local = K_local + 0x20;
  }
  return;
}

Assistant:

void WebRtcSpl_Resample44khzTo32khz(const int32_t *In, int32_t *Out, size_t K)
{
    /////////////////////////////////////////////////////////////
    // Filter operation:
    //
    // Perform resampling (11 input samples -> 8 output samples);
    // process in sub blocks of size 11 samples.
    int32_t tmp;
    size_t m;

    for (m = 0; m < K; m++)
    {
        tmp = 1 << 14;

        // first output sample
        Out[0] = ((int32_t)In[3] << 15) + tmp;

        // sum and accumulate filter coefficients and input samples
        tmp += kCoefficients44To32[3][0] * In[5];
        tmp += kCoefficients44To32[3][1] * In[6];
        tmp += kCoefficients44To32[3][2] * In[7];
        tmp += kCoefficients44To32[3][3] * In[8];
        tmp += kCoefficients44To32[3][4] * In[9];
        tmp += kCoefficients44To32[3][5] * In[10];
        tmp += kCoefficients44To32[3][6] * In[11];
        tmp += kCoefficients44To32[3][7] * In[12];
        tmp += kCoefficients44To32[3][8] * In[13];
        Out[4] = tmp;

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[0], &In[17], kCoefficients44To32[0], &Out[1], &Out[7]);

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[2], &In[15], kCoefficients44To32[1], &Out[2], &Out[6]);

        // sum and accumulate filter coefficients and input samples
        WebRtcSpl_ResampDotProduct(&In[3], &In[14], kCoefficients44To32[2], &Out[3], &Out[5]);

        // update pointers
        In += 11;
        Out += 8;
    }
}